

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::PortPackedVisitor::process_struct_
          (PortPackedVisitor *this,PackedStruct *struct_def,Var *var)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  mapped_type *ppPVar2;
  mapped_type *ppVVar3;
  uint32_t *this_00;
  reference pPVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar5 [16];
  format_args args;
  string_view format_str;
  PackedStructFieldDef *attr;
  iterator __end3;
  iterator __begin3;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *__range3;
  allocator<const_kratos::IRNode_*> local_121;
  Var *local_120;
  mapped_type local_118;
  Var **local_110;
  size_type local_108;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_100;
  string local_d8;
  PackedStruct *local_b8;
  PackedStruct *struct_;
  _Self local_a8;
  Var *local_a0;
  Var *var_local;
  PackedStruct *struct_def_local;
  PortPackedVisitor *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a0 = var;
  var_local = (Var *)struct_def;
  struct_def_local = (PackedStruct *)this;
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
       ::find(&this->structs_,&struct_def->struct_name);
  struct_ = (PackedStruct *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
            ::end(&this->structs_);
  bVar1 = std::operator!=(&local_a8,(_Self *)&struct_);
  if (bVar1) {
    ppPVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
              ::at(&this->structs_,(key_type *)var_local);
    local_b8 = *ppPVar2;
    bVar1 = PackedStruct::same((PackedStruct *)var_local,local_b8);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      local_38 = &local_d8;
      local_40 = "redefinition of different packed struct {0}";
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)var_local;
      local_68.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string&,char[44],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"redefinition of different packed struct {0}",(v7 *)var_local,auVar5._8_8_,
                      (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                      "redefinition of different packed struct {0}");
      local_50 = &local_68;
      local_78 = fmt::v7::to_string_view<char,_0>(local_40);
      local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_30 = local_50;
      local_20 = local_50;
      local_10 = local_50;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_50->string);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_80.values_;
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_78.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_d8,(detail *)local_78.data_,format_str,args);
      local_120 = local_a0;
      ppVVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
                ::at(&this->struct_ports_,(key_type *)var_local);
      local_118 = *ppVVar3;
      local_110 = &local_120;
      local_108 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_121);
      __l._M_len = local_108;
      __l._M_array = (iterator)local_110;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_100,__l,&local_121);
      VarException::VarException(auVar5._0_8_,&local_d8,&local_100);
      __cxa_throw(auVar5._0_8_,&VarException::typeinfo,VarException::~VarException);
    }
  }
  else {
    std::
    map<std::__cxx11::string,kratos::PackedStruct_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>>
    ::emplace<std::__cxx11::string&,kratos::PackedStruct*&>
              ((map<std::__cxx11::string,kratos::PackedStruct_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>>
                *)&this->structs_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)var_local,
               (PackedStruct **)&var_local);
    std::
    map<std::__cxx11::string,kratos::Var*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
    ::emplace<std::__cxx11::string&,kratos::Var*&>
              ((map<std::__cxx11::string,kratos::Var*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
                *)&this->struct_ports_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)var_local,
               &local_a0);
    this_00 = &(var_local->super_IRNode).verilog_ln;
    __end3 = std::
             vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
             begin((vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                    *)this_00);
    attr = (PackedStructFieldDef *)
           std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ::end((vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                  *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                                       *)&attr), bVar1) {
      pPVar4 = __gnu_cxx::
               __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
               ::operator*(&__end3);
      if (pPVar4->struct_ != (PackedStruct *)0x0) {
        process_struct_(this,pPVar4->struct_,local_a0);
      }
      __gnu_cxx::
      __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void process_struct_(PackedStruct* struct_def, Var* var) {
        if (structs_.find(struct_def->struct_name) != structs_.end()) {
            // do some checking
            auto const* struct_ = structs_.at(struct_def->struct_name);
            if (!struct_def->same(*struct_)) {
                throw VarException(::format("redefinition of different packed struct {0}",
                                            struct_def->struct_name),
                                   {var, struct_ports_.at(struct_def->struct_name)});
            }
        } else {
            structs_.emplace(struct_def->struct_name, struct_def);
            struct_ports_.emplace(struct_def->struct_name, var);

            // check if there is any struct inside attributes
            for (auto const& attr : struct_def->attributes) {
                if (attr.struct_) {
                    process_struct_(attr.struct_, var);
                }
            }
        }
    }